

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__resample_row_h_2(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  
  bVar1 = *in_near;
  if (w == 1) {
    out[1] = bVar1;
    *out = bVar1;
    return out;
  }
  *out = bVar1;
  out[1] = (stbi_uc)((uint)(ushort)bVar1 + (uint)(ushort)bVar1 * 2 + (uint)in_near[1] + 2 >> 2);
  uVar2 = w - 1;
  uVar3 = 2;
  if (2 < w) {
    lVar4 = 0;
    do {
      iVar5 = (uint)in_near[lVar4 + 1] + (uint)in_near[lVar4 + 1] * 2;
      out[lVar4 * 2 + 2] = (stbi_uc)((uint)in_near[lVar4] + iVar5 + 2 >> 2);
      out[lVar4 * 2 + 3] = (stbi_uc)(iVar5 + (uint)in_near[lVar4 + 2] + 2 >> 2);
      lVar4 = lVar4 + 1;
    } while ((ulong)uVar2 - 1 != lVar4);
    uVar3 = uVar2 * 2;
  }
  out[uVar3] = (stbi_uc)((uint)in_near[(long)w + -2] + (uint)in_near[(long)w + -2] * 2 +
                         (uint)in_near[(int)uVar2] + 2 >> 2);
  out[(ulong)uVar3 + 1] = in_near[(int)uVar2];
  return out;
}

Assistant:

static stbi_uc*  stbi__resample_row_h_2(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate two samples horizontally for every one in input
   int i;
   stbi_uc *input = in_near;

   if (w == 1) {
      // if only one sample, can't do any interpolation
      out[0] = out[1] = input[0];
      return out;
   }

   out[0] = input[0];
   out[1] = stbi__div4(input[0]*3 + input[1] + 2);
   for (i=1; i < w-1; ++i) {
      int n = 3*input[i]+2;
      out[i*2+0] = stbi__div4(n+input[i-1]);
      out[i*2+1] = stbi__div4(n+input[i+1]);
   }
   out[i*2+0] = stbi__div4(input[w-2]*3 + input[w-1] + 2);
   out[i*2+1] = input[w-1];

   STBI_NOTUSED(in_far);
   STBI_NOTUSED(hs);

   return out;
}